

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O0

void randomx_vm_set_cache(randomx_vm *machine,randomx_cache *cache)

{
  bool bVar1;
  uint8_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  randomx_vm *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator!=(in_RSI,in_stack_ffffffffffffffe8);
  if ((!bVar1) && (puVar2 = randomx_vm::getMemory(in_RDI), puVar2 == *(uint8_t **)in_RSI)) {
    return;
  }
  (*in_RDI->_vptr_randomx_vm[6])(in_RDI,in_RSI);
  std::__cxx11::string::operator=((string *)&in_RDI->cacheKey,(string *)(in_RSI + 0x8380));
  return;
}

Assistant:

void randomx_vm_set_cache(randomx_vm *machine, randomx_cache* cache) {
		assert(machine != nullptr);
		assert(cache != nullptr && cache->isInitialized());
		if (machine->cacheKey != cache->cacheKey || machine->getMemory() != cache->memory) {
			machine->setCache(cache);
			machine->cacheKey = cache->cacheKey;
		}
	}